

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O0

void __thiscall
Omega_h::MetricEdgeLengths<2,_2>::MetricEdgeLengths
          (MetricEdgeLengths<2,_2> *this,Mesh *mesh,Reals *metrics_in)

{
  Reals *metrics_in_local;
  Mesh *mesh_local;
  MetricEdgeLengths<3,_3> *this_local;
  
  Omega_h::Mesh::coords((Mesh *)this);
  Read<double>::Read(&this->metrics,metrics_in);
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}